

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyDataSPKM::LoadCScript(LegacyDataSPKM *this,CScript *redeemScript)

{
  long lVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  string strAddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff28;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  ScriptHash *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar3;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  ConstevalFormatString<4U> in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff28);
  if (sVar2 < 0x209) {
    bVar3 = FillableSigningProvider::AddCScript
                      ((FillableSigningProvider *)in_stack_ffffffffffffff78,
                       (CScript *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    this_00 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffff74;
    ScriptHash::ScriptHash(in_stack_ffffffffffffff30,(CScript *)this_00);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<ScriptHash,void,void,ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)this_00,
               (ScriptHash *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    EncodeDestination_abi_cxx11_((CTxDestination *)this_00);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffff18);
    sVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(this_00);
    wallet::ScriptPubKeyMan::
    WalletLogPrintf<char[12],unsigned_int,unsigned_int,std::__cxx11::string>
              ((ScriptPubKeyMan *)in_stack_ffffffffffffff78,in_stack_ffffffffffffffa8,
               (char (*) [12])CONCAT44(in_stack_ffffffffffffff74,sVar2),
               (uint *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RDI,in_RSI);
    bVar3 = 1;
    std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::LoadCScript(const CScript& redeemScript)
{
    /* A sanity check was added in pull #3843 to avoid adding redeemScripts
     * that never can be redeemed. However, old wallets may still contain
     * these. Do not add them to the wallet and warn. */
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE)
    {
        std::string strAddr = EncodeDestination(ScriptHash(redeemScript));
        WalletLogPrintf("%s: Warning: This wallet contains a redeemScript of size %i which exceeds maximum size %i thus can never be redeemed. Do not use address %s.\n", __func__, redeemScript.size(), MAX_SCRIPT_ELEMENT_SIZE, strAddr);
        return true;
    }

    return FillableSigningProvider::AddCScript(redeemScript);
}